

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O1

MPP_RET hal_h265e_v540c_ret_task(void *hal,HalEncTask *task)

{
  RK_S32 *pRVar1;
  int iVar2;
  int iVar3;
  EncRcTask *pEVar4;
  EncRcTask *pEVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  
  pEVar4 = task->rc_task;
  sVar9 = mpp_packet_get_length(task->packet);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x698);
  }
  pEVar5 = task->rc_task;
  iVar7 = *(int *)(*(long *)((long)hal + 0x1c0) + 0xc);
  iVar2 = *(int *)(*(long *)((long)hal + 0x1c0) + 0x10);
  iVar3 = iVar7 + 0x3f;
  iVar7 = iVar7 + 0x7e;
  if (-1 < iVar3) {
    iVar7 = iVar3;
  }
  iVar3 = iVar2 + 0x3f;
  iVar2 = iVar2 + 0x7e;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  puVar6 = *(uint **)((long)hal + 0x78);
  uVar14 = *puVar6;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x5c8);
  }
  *(int *)((long)hal + 0x8c) = *(int *)((long)hal + 0x8c) + puVar6[4];
  *(int *)((long)hal + 0x90) = *(int *)((long)hal + 0x90) + puVar6[1];
  *(long *)((long)hal + 0x98) =
       *(long *)((long)hal + 0x98) + (ulong)(puVar6[3] << 0x10 | puVar6[2] >> 0x10);
  *(uint *)((long)hal + 0x88) = uVar14;
  if (((byte)hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","hw_status: 0x%08x",(char *)0x0,(ulong)uVar14);
  }
  if ((uVar14 & 2) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_LINKTABLE_FINISH","vepu540c_h265_set_feedback");
  }
  if (((uVar14 & 1) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v540c","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
  }
  if ((uVar14 & 8) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_ONE_SLICE_FINISH","vepu540c_h265_set_feedback");
  }
  if ((uVar14 & 4) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_SAFE_CLEAR_FINISH","vepu540c_h265_set_feedback");
  }
  if ((uVar14 & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_BIT_STREAM_OVERFLOW","vepu540c_h265_set_feedback");
  }
  if ((uVar14 & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_BUS_WRITE_FULL","vepu540c_h265_set_feedback");
  }
  if ((uVar14 & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_BUS_WRITE_ERROR","vepu540c_h265_set_feedback");
  }
  if ((char)uVar14 < '\0') {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_BUS_READ_ERROR","vepu540c_h265_set_feedback");
  }
  if ((uVar14 >> 8 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v540c","RKV_ENC_INT_TIMEOUT_ERROR","vepu540c_h265_set_feedback");
  }
  uVar14 = puVar6[0x29];
  iVar3 = *(int *)((long)hal + 0x198);
  *(uint *)((long)hal + 0x198) = iVar3 + (uVar14 & 0x7fffff);
  *(int *)((long)hal + 0xa0) = *(int *)((long)hal + 0xa0) + (puVar6[0x21] & 0x1ffff);
  *(int *)((long)hal + 0xa4) = *(int *)((long)hal + 0xa4) + (puVar6[0x22] & 0x7ffff);
  iVar15 = (puVar6[0x25] & 0x7ffff) + *(int *)((long)hal + 0xb0);
  *(int *)((long)hal + 0xb0) = iVar15;
  *(int *)((long)hal + 0xa8) = *(int *)((long)hal + 0xa8) + (puVar6[0x23] & 0x1fffff);
  iVar11 = (puVar6[0x26] & 0x1fffff) + *(int *)((long)hal + 0xb4);
  *(int *)((long)hal + 0xb4) = iVar11;
  *(int *)((long)hal + 0xac) = *(int *)((long)hal + 0xac) + (puVar6[0x24] & 0x7fffff);
  iVar13 = (puVar6[0x27] & 0x7fffff) + *(int *)((long)hal + 0xb8);
  *(int *)((long)hal + 0xb8) = iVar13;
  iVar12 = (puVar6[0x28] & 0x7fffff) + *(int *)((long)hal + 0xbc);
  iVar7 = (iVar2 >> 6) * (iVar7 >> 6);
  *(int *)((long)hal + 0xbc) = iVar12;
  memcpy((void *)((long)hal + 0xc0),puVar6 + 0x61,0xd0);
  pRVar1 = &(pEVar5->info).bit_real;
  *pRVar1 = *pRVar1 + *(int *)((long)hal + 0x90) * 8;
  uVar10 = 0;
  uVar8 = 0;
  uVar14 = (uVar14 & 0x7fffff) + iVar3;
  if (uVar14 != 0) {
    uVar8 = *(uint *)((long)hal + 0x194) / uVar14;
  }
  *(uint *)((long)hal + 0x194) = uVar8;
  if (*(uint *)((long)hal + 0x19c) != 0) {
    uVar10 = *(uint *)((long)hal + 400) / *(uint *)((long)hal + 0x19c);
  }
  *(uint *)((long)hal + 400) = uVar10;
  if (0 < iVar7 * 0x100) {
    (pEVar5->info).iblk4_prop =
         (uint)((iVar12 + iVar13) * 0x400 + iVar15 * 0x4000 + iVar11 * 0x1000) /
         (uint)(iVar7 * 0x100);
  }
  if (0 < iVar7) {
    (pEVar5->info).quality_real = *(uint *)((long)hal + 0x8c) / (uint)(iVar7 * 0x40);
  }
  (pEVar5->info).madi = *(RK_S32 *)((long)hal + 0x194);
  (pEVar5->info).madp = *(RK_S32 *)((long)hal + 400);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0x61b);
  }
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar9,*(RK_U32 *)((long)hal + 0x90),"hal_h265e_v540c_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)((long)hal + 0x90));
  (pEVar4->info).sse = *(RK_S64 *)((long)hal + 0x98);
  (pEVar4->info).lvl64_inter_num = *(RK_U32 *)((long)hal + 0xa0);
  (pEVar4->info).lvl32_inter_num = *(RK_U32 *)((long)hal + 0xa4);
  (pEVar4->info).lvl16_inter_num = *(RK_U32 *)((long)hal + 0xa8);
  (pEVar4->info).lvl8_inter_num = *(RK_U32 *)((long)hal + 0xac);
  (pEVar4->info).lvl32_intra_num = *(RK_U32 *)((long)hal + 0xb0);
  (pEVar4->info).lvl16_intra_num = *(RK_U32 *)((long)hal + 0xb4);
  (pEVar4->info).lvl8_intra_num = *(RK_U32 *)((long)hal + 0xb8);
  (pEVar4->info).lvl4_intra_num = *(RK_U32 *)((long)hal + 0xbc);
  iVar3 = *(int *)((long)hal + 0x90);
  task->hw_length = iVar3;
  task->length = task->length + iVar3;
  if (((byte)hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","output stream size %d\n",(char *)0x0);
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0x6ad);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v540c_ret_task(void *hal, HalEncTask *task)
{
    H265eV540cHalContext *ctx = (H265eV540cHalContext *)hal;
    HalEncTask *enc_task = task;
    vepu540c_h265_fbk *fb = &ctx->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu540c_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);

    hal_h265e_leave();
    return MPP_OK;
}